

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEventList.cpp
# Opt level: O3

void __thiscall smf::MidiEventList::MidiEventList(MidiEventList *this,MidiEventList *other)

{
  pointer *pppMVar1;
  pointer ppMVar2;
  iterator __position;
  MidiEvent *in_RAX;
  MidiEvent *this_00;
  long lVar3;
  long lVar4;
  MidiEvent *local_38;
  
  (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = in_RAX;
  std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::reserve
            (&this->list,
             (long)(other->list).
                   super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(other->list).
                   super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  ppMVar2 = (other->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(other->list).
                super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)ppMVar2;
  if (lVar4 != 0) {
    lVar3 = 0;
    do {
      this_00 = (MidiEvent *)operator_new(0x38);
      MidiEvent::MidiEvent(this_00,ppMVar2[lVar3]);
      __position._M_current =
           (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_38 = this_00;
      if (__position._M_current ==
          (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<smf::MidiEvent*,std::allocator<smf::MidiEvent*>>::
        _M_realloc_insert<smf::MidiEvent*>
                  ((vector<smf::MidiEvent*,std::allocator<smf::MidiEvent*>> *)this,__position,
                   &local_38);
      }
      else {
        *__position._M_current = this_00;
        pppMVar1 = &(this->list).
                    super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppMVar1 = *pppMVar1 + 1;
      }
      lVar3 = lVar3 + 1;
    } while (lVar4 >> 3 != lVar3);
  }
  return;
}

Assistant:

MidiEventList::MidiEventList(const MidiEventList& other) {
	list.reserve(other.list.size());
	auto it = other.list.begin();
	std::generate_n(std::back_inserter(list), other.list.size(), [&]() -> MidiEvent* {
		return new MidiEvent(**it++);
	});
}